

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

int32_t __thiscall icu_63::BMPSet::findCodePoint(BMPSet *this,UChar32 c,int32_t lo,int32_t hi)

{
  int32_t *piVar1;
  int32_t iVar2;
  
  piVar1 = this->list;
  iVar2 = lo;
  if (((piVar1[lo] <= c) && (iVar2 = hi, lo < hi)) && (c < piVar1[(long)hi + -1])) {
    while (iVar2 = hi, hi = iVar2 + lo >> 1, hi != lo) {
      if (piVar1[hi] <= c) {
        lo = hi;
        hi = iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t BMPSet::findCodePoint(UChar32 c, int32_t lo, int32_t hi) const {
    /* Examples:
                                       findCodePoint(c)
       set              list[]         c=0 1 3 4 7 8
       ===              ==============   ===========
       []               [110000]         0 0 0 0 0 0
       [\u0000-\u0003]  [0, 4, 110000]   1 1 1 2 2 2
       [\u0004-\u0007]  [4, 8, 110000]   0 0 0 1 1 2
       [:Any:]          [0, 110000]      1 1 1 1 1 1
     */

    // Return the smallest i such that c < list[i].  Assume
    // list[len - 1] == HIGH and that c is legal (0..HIGH-1).
    if (c < list[lo])
        return lo;
    // High runner test.  c is often after the last range, so an
    // initial check for this condition pays off.
    if (lo >= hi || c >= list[hi-1])
        return hi;
    // invariant: c >= list[lo]
    // invariant: c < list[hi]
    for (;;) {
        int32_t i = (lo + hi) >> 1;
        if (i == lo) {
            break; // Found!
        } else if (c < list[i]) {
            hi = i;
        } else {
            lo = i;
        }
    }
    return hi;
}